

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::NegativeGLSLLinkTimeErrors::Link
          (NegativeGLSLLinkTimeErrors *this,string *cs0,string *cs1)

{
  GLuint program;
  GLuint GVar1;
  CallLogWrapper *this_00;
  char *format;
  bool bVar2;
  GLint status;
  GLchar log [1024];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
  glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
  log._0_8_ = (cs0->_M_dataplus)._M_p;
  glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,(GLchar **)log,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  glu::CallLogWrapper::glGetShaderiv(this_00,GVar1,0x8b81,&status);
  if (status == 0) {
    glu::CallLogWrapper::glDeleteProgram(this_00,program);
    format = "CS0 compilation should be ok.\n";
  }
  else {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    log._0_8_ = (cs1->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,(GLchar **)log,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
    glu::CallLogWrapper::glGetShaderiv(this_00,GVar1,0x8b81,&status);
    if (status != 0) {
      glu::CallLogWrapper::glLinkProgram(this_00,program);
      glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,(GLsizei *)0x0,log);
      anon_unknown_0::Output("Program Info Log:\n%s\n",log);
      glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&status);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      bVar2 = status != 1;
      if (bVar2) {
        return bVar2;
      }
      format = "Link operation should fail.\n";
      goto LAB_009d83d9;
    }
    glu::CallLogWrapper::glDeleteProgram(this_00,program);
    format = "CS1 compilation should be ok.\n";
  }
  bVar2 = false;
LAB_009d83d9:
  anon_unknown_0::Output(format);
  return bVar2;
}

Assistant:

bool Link(const std::string& cs0, const std::string& cs1)
	{
		const GLuint p = glCreateProgram();

		/* shader 0 */
		{
			GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src = cs0.c_str();
			glShaderSource(sh, 1, &src, NULL);
			glCompileShader(sh);

			GLint status;
			glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
			if (status == GL_FALSE)
			{
				glDeleteProgram(p);
				Output("CS0 compilation should be ok.\n");
				return false;
			}
		}
		/* shader 1 */
		{
			GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src = cs1.c_str();
			glShaderSource(sh, 1, &src, NULL);
			glCompileShader(sh);

			GLint status;
			glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
			if (status == GL_FALSE)
			{
				glDeleteProgram(p);
				Output("CS1 compilation should be ok.\n");
				return false;
			}
		}

		glLinkProgram(p);

		GLchar log[1024];
		glGetProgramInfoLog(p, sizeof(log), NULL, log);
		Output("Program Info Log:\n%s\n", log);

		GLint status;
		glGetProgramiv(p, GL_LINK_STATUS, &status);
		glDeleteProgram(p);

		if (status == GL_TRUE)
		{
			Output("Link operation should fail.\n");
			return false;
		}

		return true;
	}